

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<const_void_*>::setCapacity(Vector<const_void_*> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> newBuilder;
  size_t newSize_local;
  Vector<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<const_void_*>::size((ArrayBuilder<const_void_*> *)this);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<const_void_*>::truncate
              ((ArrayBuilder<const_void_*> *)this,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<void_const*>
            ((ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<void_const*>>
                     ((ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)
                      this);
  ArrayBuilder<void_const*>::addAll<kj::ArrayBuilder<void_const*>>
            ((ArrayBuilder<void_const*> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<void_const*>>
                     ((ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)
                      local_38);
  ArrayBuilder<const_void_*>::operator=((ArrayBuilder<const_void_*> *)this,pAVar2);
  ArrayBuilder<const_void_*>::~ArrayBuilder((ArrayBuilder<const_void_*> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }